

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASParallelOperationCreateExt
          (ze_driver_handle_t hDriver,ze_rtas_parallel_operation_ext_handle_t *phParallelOperation)

{
  ze_rtas_parallel_operation_ext_handle_t p_Var1;
  ze_pfnRTASParallelOperationCreateExt_t pfnCreateExt;
  ze_result_t result;
  ze_rtas_parallel_operation_ext_handle_t *phParallelOperation_local;
  ze_driver_handle_t hDriver_local;
  
  pfnCreateExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c180 == (code *)0x0) {
    p_Var1 = (ze_rtas_parallel_operation_ext_handle_t)context_t::get((context_t *)&context);
    *phParallelOperation = p_Var1;
  }
  else {
    pfnCreateExt._4_4_ = (*DAT_0011c180)(hDriver,phParallelOperation);
  }
  return pfnCreateExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationCreateExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_parallel_operation_ext_handle_t* phParallelOperation///< [out] handle of parallel operation object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExt = context.zeDdiTable.RTASParallelOperation.pfnCreateExt;
        if( nullptr != pfnCreateExt )
        {
            result = pfnCreateExt( hDriver, phParallelOperation );
        }
        else
        {
            // generic implementation
            *phParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_ext_handle_t>( context.get() );

        }

        return result;
    }